

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O3

string * __thiscall
flatbuffers::java::JavaGenerator::DestinationCast_abi_cxx11_
          (string *__return_storage_ptr__,JavaGenerator *this,Type *type)

{
  BaseType BVar1;
  char *pcVar2;
  char *pcVar3;
  Type local_28;
  
  BVar1 = type->base_type;
  if (BVar1 - BASE_TYPE_ARRAY < 2) {
LAB_0022481c:
    local_28.base_type = type->element;
    local_28.fixed_length = type->fixed_length;
    local_28.element = BASE_TYPE_NONE;
    local_28.struct_def = type->struct_def;
    local_28.enum_def = type->enum_def;
    DestinationCast_abi_cxx11_(__return_storage_ptr__,this,&local_28);
  }
  else {
    if (BVar1 == BASE_TYPE_UINT) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "(long)";
      pcVar2 = "";
    }
    else {
      if (BVar1 == BASE_TYPE_VECTOR) goto LAB_0022481c;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = "";
      pcVar3 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DestinationCast(const Type &type) const {
    if (IsSeries(type)) {
      return DestinationCast(type.VectorType());
    } else {
      // Cast necessary to correctly read serialized unsigned values.
      if (type.base_type == BASE_TYPE_UINT) return "(long)";
    }
    return "";
  }